

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

Bit8u NOPN2_Read(ym3438_t *chip,Bit32u port)

{
  ushort uVar1;
  Bit16u testdata;
  Bit32u slot;
  Bit32u port_local;
  ym3438_t *chip_local;
  
  if (((port & 3) == 0) || ((chip->chip_type & 2) != 0)) {
    if (chip->mode_test_21[6] == '\0') {
      chip->status = chip->busy << 7 | chip->timer_b_overflow_flag << 1 |
                     chip->timer_a_overflow_flag;
    }
    else {
      if (chip->mode_test_2c[4] == '\0') {
        uVar1 = chip->fm_out[(chip->cycles + 0x12) % 0x18] & 0x3fff;
      }
      else {
        uVar1 = chip->ch_read & 0x1ff;
      }
      if (chip->mode_test_21[7] == '\0') {
        chip->status = (byte)(((chip->pg_read & 1) << 0xf) >> 8) |
                       (byte)(((chip->eg_read[chip->mode_test_21[0]] & 1) << 0xe) >> 8) |
                       (byte)(uVar1 >> 8);
      }
      else {
        chip->status = (Bit8u)uVar1;
      }
    }
    if ((chip->chip_type & 1) == 0) {
      chip->status_time = 40000000;
    }
    else {
      chip->status_time = 300000;
    }
  }
  if (chip->status_time == 0) {
    chip_local._7_1_ = '\0';
  }
  else {
    chip_local._7_1_ = chip->status;
  }
  return chip_local._7_1_;
}

Assistant:

Bit8u NOPN2_Read(ym3438_t *chip, Bit32u port)
{
    if ((port & 3) == 0 || (chip->chip_type & ym3438_mode_readmode))
    {
        if (chip->mode_test_21[6])
        {
            /* Read test data */
            Bit32u slot = (chip->cycles + 18) % 24;
            Bit16u testdata = ((chip->pg_read & 0x01) << 15)
                            | ((chip->eg_read[chip->mode_test_21[0]] & 0x01) << 14);
            if (chip->mode_test_2c[4])
            {
                testdata |= chip->ch_read & 0x1ff;
            }
            else
            {
                testdata |= chip->fm_out[slot] & 0x3fff;
            }
            if (chip->mode_test_21[7])
            {
                chip->status = testdata & 0xff;
            }
            else
            {
                chip->status = testdata >> 8;
            }
        }
        else
        {
            chip->status = (chip->busy << 7) | (chip->timer_b_overflow_flag << 1)
                 | chip->timer_a_overflow_flag;
        }
        if (chip->chip_type & ym3438_mode_ym2612)
        {
            chip->status_time = 300000;
        }
        else
        {
            chip->status_time = 40000000;
        }
    }
    if (chip->status_time)
    {
        return chip->status;
    }
    return 0;
}